

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O0

void __thiscall
ELFIO::symbol_section_accessor_template<ELFIO::section>::find_hash_section
          (symbol_section_accessor_template<ELFIO::section> *this)

{
  Elf_Half EVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  section *psVar5;
  section *sec;
  Elf_Half i;
  Elf_Half nSecNo;
  symbol_section_accessor_template<ELFIO::section> *this_local;
  
  EVar1 = elfio::Sections::size(&this->elf_file->sections);
  sec._4_2_ = 0;
  while( true ) {
    if (EVar1 <= sec._4_2_) {
      return;
    }
    psVar5 = elfio::Sections::operator[](&this->elf_file->sections,(uint)sec._4_2_);
    uVar2 = (*psVar5->_vptr_section[0xb])();
    uVar3 = (*this->symbol_section->_vptr_section[2])();
    if ((uVar2 == (uVar3 & 0xffff)) &&
       (((iVar4 = (*psVar5->_vptr_section[5])(), iVar4 == 5 ||
         (iVar4 = (*psVar5->_vptr_section[5])(), iVar4 == 0x6ffffff6)) ||
        (iVar4 = (*psVar5->_vptr_section[5])(), iVar4 == 0x6ffffef5)))) break;
    sec._4_2_ = sec._4_2_ + 1;
  }
  this->hash_section = psVar5;
  this->hash_section_index = sec._4_2_;
  return;
}

Assistant:

void find_hash_section()
    {
        Elf_Half nSecNo = elf_file.sections.size();
        for ( Elf_Half i = 0; i < nSecNo; ++i ) {
            const section* sec = elf_file.sections[i];
            if ( sec->get_link() == symbol_section->get_index() &&
                 ( sec->get_type() == SHT_HASH ||
                   sec->get_type() == SHT_GNU_HASH ||
                   sec->get_type() == DT_GNU_HASH ) ) {
                hash_section       = sec;
                hash_section_index = i;
                break;
            }
        }
    }